

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O0

void __thiscall cppcms::plugin::scope::load(scope *this,string *name)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  _data *p_Var4;
  shared_object *this_00;
  size_type sVar5;
  reference pvVar6;
  element_type *peVar7;
  ostream *poVar8;
  size_type sVar9;
  undefined8 uVar10;
  hold_ptr<cppcms::plugin::scope::_data> *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  size_t i_1;
  ostringstream ss;
  string path;
  size_t i;
  int dlflags;
  shared_ptr<booster::shared_object> obj;
  string so_name;
  unique_lock<std::mutex> guard;
  _class_data *cls;
  undefined7 in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffabf;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac8;
  basic_format<char> *in_stack_fffffffffffffad0;
  value_type *in_stack_fffffffffffffad8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae8;
  key_type *in_stack_fffffffffffffaf8;
  basic_format<char> *in_stack_fffffffffffffb00;
  char *in_stack_fffffffffffffb08;
  size_type local_440;
  ostringstream local_438 [152];
  locale *in_stack_fffffffffffffc60;
  basic_format<char> *in_stack_fffffffffffffc68;
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  ulong local_260;
  undefined1 local_251;
  undefined4 local_22c;
  string local_218 [360];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [36];
  int local_4c;
  _Self local_48 [3];
  _Self local_30 [3];
  _class_data *local_18;
  
  local_18 = class_data();
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_fffffffffffffac0._M_node,
             (mutex_type *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8));
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffac8,in_stack_fffffffffffffac0._M_node);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8));
  bVar1 = std::operator!=(local_30,local_48);
  if (bVar1) {
    local_4c = 1;
  }
  else {
    std::__cxx11::string::string(local_70);
    booster::hold_ptr<cppcms::plugin::scope::_data>::operator->(in_RDI);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      p_Var4 = booster::hold_ptr<cppcms::plugin::scope::_data>::operator->(in_RDI);
      std::__cxx11::string::string(local_218,(string *)&p_Var4->pattern);
      booster::locale::basic_format<char>::basic_format
                (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      booster::locale::basic_format<char>::operator%
                (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      std::locale::classic();
      booster::locale::basic_format<char>::str_abi_cxx11_
                (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
      std::__cxx11::string::operator=(local_70,local_b0);
      std::__cxx11::string::~string(local_b0);
      booster::locale::basic_format<char>::~basic_format
                ((basic_format<char> *)in_stack_fffffffffffffac0._M_node);
      std::__cxx11::string::~string(local_218);
    }
    else {
      booster::shared_object::name(local_90);
      std::__cxx11::string::operator=(local_70,local_90);
      std::__cxx11::string::~string(local_90);
    }
    this_00 = (shared_object *)operator_new(8);
    booster::shared_object::shared_object(this_00);
    std::shared_ptr<booster::shared_object>::shared_ptr<booster::shared_object,void>
              ((shared_ptr<booster::shared_object> *)in_stack_fffffffffffffac0._M_node,
               (shared_object *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8));
    local_22c = 5;
    booster::hold_ptr<cppcms::plugin::scope::_data>::operator->(in_RDI);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffad0);
    if (bVar1) {
      peVar7 = std::
               __shared_ptr_access<booster::shared_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<booster::shared_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4729f7);
      bVar2 = booster::shared_object::open((string *)peVar7,(int)local_70);
      if ((bVar2 & 1) == 0) {
        local_251 = 1;
        uVar10 = __cxa_allocate_exception(0x30);
        std::operator+(in_stack_fffffffffffffb08,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb00);
        cppcms_error::cppcms_error
                  ((cppcms_error *)in_stack_fffffffffffffac0._M_node,
                   (string *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8));
        local_251 = 0;
        __cxa_throw(uVar10,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
      }
    }
    else {
      local_260 = 0;
      while( true ) {
        uVar3 = local_260;
        p_Var4 = booster::hold_ptr<cppcms::plugin::scope::_data>::operator->(in_RDI);
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&p_Var4->paths);
        if (sVar5 <= uVar3) break;
        p_Var4 = booster::hold_ptr<cppcms::plugin::scope::_data>::operator->(in_RDI);
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&p_Var4->paths,local_260);
        std::__cxx11::string::string(local_280,(string *)pvVar6);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          std::operator+(in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0);
          std::operator+(in_stack_fffffffffffffac8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffac0._M_node);
          std::__cxx11::string::operator=(local_280,local_2a0);
          std::__cxx11::string::~string(local_2a0);
          std::__cxx11::string::~string(local_2c0);
        }
        else {
          std::__cxx11::string::operator=(local_280,local_70);
        }
        peVar7 = std::
                 __shared_ptr_access<booster::shared_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<booster::shared_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x472ca1);
        bVar2 = booster::shared_object::open((string *)peVar7,(int)local_280);
        if ((bVar2 & 1) == 0) {
          local_4c = 0;
        }
        else {
          local_4c = 2;
        }
        std::__cxx11::string::~string(local_280);
        if (local_4c != 0) break;
        local_260 = local_260 + 1;
      }
      std::__shared_ptr_access<booster::shared_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<booster::shared_object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x472d36);
      bVar2 = booster::shared_object::is_open();
      if ((bVar2 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_438);
        poVar8 = std::operator<<((ostream *)local_438,"Failed to load ");
        poVar8 = std::operator<<(poVar8,local_70);
        std::operator<<(poVar8," from ");
        local_440 = 0;
        while( true ) {
          sVar5 = local_440;
          p_Var4 = booster::hold_ptr<cppcms::plugin::scope::_data>::operator->(in_RDI);
          sVar9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&p_Var4->paths);
          if (sVar9 <= sVar5) break;
          if (local_440 != 0) {
            std::operator<<((ostream *)local_438,", ");
          }
          poVar8 = std::operator<<((ostream *)local_438,"`");
          p_Var4 = booster::hold_ptr<cppcms::plugin::scope::_data>::operator->(in_RDI);
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&p_Var4->paths,local_440);
          poVar8 = std::operator<<(poVar8,(string *)pvVar6);
          std::operator<<(poVar8,"\'");
          local_440 = local_440 + 1;
        }
        uVar10 = __cxa_allocate_exception(0x30);
        std::__cxx11::ostringstream::str();
        cppcms_error::cppcms_error
                  ((cppcms_error *)in_stack_fffffffffffffac0._M_node,
                   (string *)CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8));
        __cxa_throw(uVar10,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
      }
    }
    booster::hold_ptr<cppcms::plugin::scope::_data>::operator->(in_RDI);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>_>_>
                  *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    std::shared_ptr<booster::shared_object>::operator=
              ((shared_ptr<booster::shared_object> *)in_stack_fffffffffffffac0._M_node,
               (shared_ptr<booster::shared_object> *)
               CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8));
    pVar11 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::insert(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    in_stack_fffffffffffffac0 = pVar11.first._M_node;
    std::shared_ptr<booster::shared_object>::~shared_ptr
              ((shared_ptr<booster::shared_object> *)0x473005);
    std::__cxx11::string::~string(local_70);
    local_4c = 0;
  }
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)in_stack_fffffffffffffac0._M_node);
  return;
}

Assistant:

void scope::load(std::string const &name)
{
	_class_data &cls = class_data();
	booster::unique_lock<booster::mutex> guard(cls.lock);
	if(cls.modules.find(name)!=cls.modules.end())
		return;
	std::string so_name;
	if(d->pattern.empty())
		so_name = booster::shared_object::name(name);
	else
		so_name = (booster::locale::format(d->pattern) % name).str(std::locale::classic());

	booster::shared_ptr<booster::shared_object> obj(new booster::shared_object());
	int dlflags = booster::shared_object::load_lazy |  booster::shared_object::load_global;
	if(d->paths.empty()) {
		if(!obj->open(so_name,dlflags)) 
			throw cppcms_error("Failed to load " + so_name);
	}
	else {
		for(size_t i=0;i<d->paths.size();i++) {
			std::string path  = d->paths[i];
			if(path.empty())
				path = so_name;
			else
				path = path + "/" + so_name;
			if(obj->open(path,dlflags))
				break;
		}
		if(!obj->is_open()) {
			std::ostringstream ss;
			ss << "Failed to load " << so_name << " from ";
			for(size_t i=0;i<d->paths.size();i++) {
				if(i!=0) {
					ss << ", ";
				}
				ss << "`" << d->paths[i] << "'";
			}
			throw cppcms_error(ss.str());
		}
	}
	d->objects[name]=obj;
	cls.modules.insert(name);
}